

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O1

int Saig_ManDetectConstr(Aig_Man_t *p,int iOut,Vec_Ptr_t **pvOuts,Vec_Ptr_t **pvCons)

{
  Aig_Obj_t *pAVar1;
  void *Entry;
  ulong uVar2;
  Vec_Ptr_t **ppVVar3;
  uint uVar4;
  void **ppvVar5;
  Vec_Ptr_t *vSuper;
  Vec_Ptr_t *pVVar6;
  long lVar7;
  int iVar8;
  char *__s;
  Aig_Obj_t *pAVar9;
  int *piVar10;
  Vec_Ptr_t *local_50;
  Vec_Ptr_t *local_48;
  Vec_Ptr_t **local_40;
  Vec_Ptr_t **local_38;
  
  if ((iOut < 0) || (p->nTruePos <= iOut)) {
    __assert_fail("iOut >= 0 && iOut < Saig_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigConstr.c"
                  ,0xa3,"int Saig_ManDetectConstr(Aig_Man_t *, int, Vec_Ptr_t **, Vec_Ptr_t **)");
  }
  *pvOuts = (Vec_Ptr_t *)0x0;
  *pvCons = (Vec_Ptr_t *)0x0;
  pVVar6 = local_48;
  if (p->vCos->nSize <= iOut) {
LAB_006d725a:
    local_48 = pVVar6;
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pAVar9 = *(Aig_Obj_t **)((long)p->vCos->pArray[(uint)iOut] + 8);
  pAVar1 = p->pConst1;
  if (pAVar9 == (Aig_Obj_t *)((ulong)pAVar1 ^ 1)) {
    pVVar6 = (Vec_Ptr_t *)malloc(0x10);
    pVVar6->nCap = 8;
    pVVar6->nSize = 0;
    ppvVar5 = (void **)malloc(0x40);
    pVVar6->pArray = ppvVar5;
    pVVar6->nSize = 1;
    *ppvVar5 = (void *)0x0;
    *ppvVar5 = pAVar1;
    *pvOuts = pVVar6;
    local_48 = pVVar6;
    pVVar6 = (Vec_Ptr_t *)malloc(0x10);
    pVVar6->nCap = 0;
    pVVar6->nSize = 0;
    pVVar6->pArray = (void **)0x0;
    *pvCons = pVVar6;
    return -1;
  }
  if ((((ulong)pAVar9 & 1) != 0) || ((*(uint *)&pAVar9->field_0x18 & 7) - 7 < 0xfffffffe)) {
    __s = "The output is not an AND.";
    goto LAB_006d6ee7;
  }
  vSuper = Saig_DetectConstrCollectSuper(pAVar9);
  if ((long)vSuper->nSize < 2) {
    __assert_fail("Vec_PtrSize(vSuper) >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigConstr.c"
                  ,0xb5,"int Saig_ManDetectConstr(Aig_Man_t *, int, Vec_Ptr_t **, Vec_Ptr_t **)");
  }
  lVar7 = 0;
  iVar8 = 0;
  do {
    piVar10 = (int *)((ulong)vSuper->pArray[lVar7] & 0xfffffffffffffffe);
    uVar4 = 0;
    if ((piVar10[6] & 7U) == 2) {
      uVar4 = (uint)(p->nTruePis <= *piVar10);
    }
    iVar8 = iVar8 + uVar4;
    lVar7 = lVar7 + 1;
  } while (vSuper->nSize != lVar7);
  if (iVar8 == 0) {
    puts("There is no flop outputs.");
    if (vSuper->pArray != (void **)0x0) {
      free(vSuper->pArray);
      vSuper->pArray = (void **)0x0;
    }
    if (vSuper == (Vec_Ptr_t *)0x0) {
      return 0;
    }
    free(vSuper);
    return 0;
  }
  local_48 = (Vec_Ptr_t *)0x0;
  local_38 = pvCons;
  if (vSuper->nSize < 1) {
    local_50 = (Vec_Ptr_t *)0x0;
    pVVar6 = (Vec_Ptr_t *)0x0;
  }
  else {
    lVar7 = 0;
    local_50 = (Vec_Ptr_t *)0x0;
    pVVar6 = (Vec_Ptr_t *)0x0;
    local_40 = pvOuts;
    do {
      Entry = vSuper->pArray[lVar7];
      piVar10 = (int *)((ulong)Entry & 0xfffffffffffffffe);
      if ((((uint)*(undefined8 *)(piVar10 + 6) & 7) == 2) && (p->nTruePis <= *piVar10)) {
        if (*piVar10 < p->nTruePis) {
          local_48 = pVVar6;
          __assert_fail("Saig_ObjIsLo(p, pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saig.h"
                        ,0x56,"Aig_Obj_t *Saig_ObjLoToLi(Aig_Man_t *, Aig_Obj_t *)");
        }
        uVar4 = (*piVar10 - p->nTruePis) + p->nTruePos;
        if (((int)uVar4 < 0) || (p->vCos->nSize <= (int)uVar4)) goto LAB_006d725a;
        uVar2 = *(ulong *)((long)p->vCos->pArray[uVar4] + 8);
        if (((uVar2 & 1) != 0) &&
           (pAVar9 = (Aig_Obj_t *)(uVar2 & 0xfffffffffffffffe),
           0xfffffffd < (*(uint *)&pAVar9->field_0x18 & 7) - 7)) {
          local_50 = Saig_DetectConstrCollectSuper(pAVar9);
          pVVar6 = Saig_ManDetectConstrCheckCont(vSuper,local_50);
          pvOuts = local_40;
          if (pVVar6 != (Vec_Ptr_t *)0x0) {
            local_48 = pVVar6;
            if (((ulong)Entry & 1) == 0) {
              if ((long)local_50->nSize < 1) goto LAB_006d71b1;
              lVar7 = 0;
              goto LAB_006d71a3;
            }
            puts("Special flop input is complemented.");
            Vec_PtrFreeP(&local_48);
            Vec_PtrFree(local_50);
            pvOuts = local_40;
            pVVar6 = local_48;
            break;
          }
          if (local_50->pArray != (void **)0x0) {
            free(local_50->pArray);
            local_50->pArray = (void **)0x0;
          }
          pvOuts = local_40;
          if (local_50 != (Vec_Ptr_t *)0x0) {
            free(local_50);
            pvOuts = local_40;
          }
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vSuper->nSize);
  }
  goto LAB_006d710b;
  while (lVar7 = lVar7 + 1, local_50->nSize != lVar7) {
LAB_006d71a3:
    if (local_50->pArray[lVar7] == Entry) {
      Vec_PtrRemove(local_50,Entry);
      pVVar6 = local_48;
      goto LAB_006d710b;
    }
  }
LAB_006d71b1:
  puts("Cannot find special flop about the inputs of OR gate.");
  Vec_PtrFreeP(&local_48);
  Vec_PtrFree(local_50);
  pVVar6 = local_48;
LAB_006d710b:
  local_48 = pVVar6;
  ppVVar3 = local_38;
  if (vSuper->pArray != (void **)0x0) {
    free(vSuper->pArray);
    vSuper->pArray = (void **)0x0;
  }
  if (vSuper != (Vec_Ptr_t *)0x0) {
    free(vSuper);
  }
  pVVar6 = local_48;
  if (local_48 != (Vec_Ptr_t *)0x0) {
    printf("Output %d : Structural analysis found %d original properties and %d constraints.\n",
           (ulong)(uint)iOut,(ulong)(uint)local_48->nSize,(ulong)(uint)local_50->nSize);
    iVar8 = local_50->nSize;
    *pvOuts = pVVar6;
    *ppVVar3 = local_50;
    return iVar8;
  }
  __s = "There is no structural constraints.";
LAB_006d6ee7:
  puts(__s);
  return 0;
}

Assistant:

int Saig_ManDetectConstr( Aig_Man_t * p, int iOut, Vec_Ptr_t ** pvOuts, Vec_Ptr_t ** pvCons )
{
    Vec_Ptr_t * vSuper, * vSuper2 = NULL, * vUnique;
    Aig_Obj_t * pObj, * pObj2, * pFlop;
    int i, nFlops, RetValue;
    assert( iOut >= 0 && iOut < Saig_ManPoNum(p) );
    *pvOuts = NULL;
    *pvCons = NULL;
    pObj = Aig_ObjChild0( Aig_ManCo(p, iOut) );
    if ( pObj == Aig_ManConst0(p) )
    {
        vUnique = Vec_PtrStart( 1 );
        Vec_PtrWriteEntry( vUnique, 0, Aig_ManConst1(p) );
        *pvOuts = vUnique;
        *pvCons = Vec_PtrAlloc( 0 );
        return -1;
    }
    if ( Aig_IsComplement(pObj) || !Aig_ObjIsNode(pObj) )
    {
        printf( "The output is not an AND.\n" );
        return 0;
    }
    vSuper = Saig_DetectConstrCollectSuper( pObj );
    assert( Vec_PtrSize(vSuper) >= 2 );
    nFlops = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pObj, i )
        nFlops += Saig_ObjIsLo( p, Aig_Regular(pObj) );
    if ( nFlops == 0 )
    {
        printf( "There is no flop outputs.\n" );
        Vec_PtrFree( vSuper );
        return 0;
    }
    // try flops 
    vUnique = NULL;
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pObj, i )
    {
        pFlop = Aig_Regular( pObj );
        if ( !Saig_ObjIsLo(p, pFlop) )
            continue;
        pFlop = Saig_ObjLoToLi( p, pFlop );
        pObj2 = Aig_ObjChild0( pFlop );
        if ( !Aig_IsComplement(pObj2) || !Aig_ObjIsNode(Aig_Regular(pObj2)) )
            continue;
        vSuper2 = Saig_DetectConstrCollectSuper( Aig_Regular(pObj2) );
        // every node in vSuper2 should appear in vSuper
        vUnique = Saig_ManDetectConstrCheckCont( vSuper, vSuper2 );
        if ( vUnique != NULL )
        {
///           assert( !Aig_IsComplement(pObj) );
 //           assert( Vec_PtrFind( vSuper2, pObj ) >= 0 );
            if ( Aig_IsComplement(pObj) )
            {
                printf( "Special flop input is complemented.\n" );
                Vec_PtrFreeP( &vUnique );
                Vec_PtrFree( vSuper2 );
                break;
            }
            if ( Vec_PtrFind( vSuper2, pObj ) == -1 )
            {
                printf( "Cannot find special flop about the inputs of OR gate.\n" );
                Vec_PtrFreeP( &vUnique );
                Vec_PtrFree( vSuper2 );
                break;
            }
            // remove the flop output
            Vec_PtrRemove( vSuper2, pObj );
            break;
        }
        Vec_PtrFree( vSuper2 );
    }
    Vec_PtrFree( vSuper );
    if ( vUnique == NULL )
    {
        printf( "There is no structural constraints.\n" );
        return 0;
    }
    // vUnique contains unique entries
    // vSuper2 contains the supergate
    printf( "Output %d : Structural analysis found %d original properties and %d constraints.\n", 
        iOut, Vec_PtrSize(vUnique), Vec_PtrSize(vSuper2) );
    // remember the number of constraints
    RetValue = Vec_PtrSize(vSuper2);
    // make the AND of properties 
//    Vec_PtrFree( vUnique );
//    Vec_PtrFree( vSuper2 );
    *pvOuts = vUnique;
    *pvCons = vSuper2;
    return RetValue;
}